

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage.cpp
# Opt level: O2

void __thiscall pstore::storage::shrink(storage *this,uint64_t new_size)

{
  pointer psVar1;
  element_type *peVar2;
  _Head_base<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_false> _Var3;
  int line;
  ulong uVar4;
  reference this_00;
  long lVar5;
  char *str;
  ulong uVar6;
  __shared_ptr<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2> local_98;
  storage *local_80;
  region_container *local_78;
  uint64_t local_70;
  ulong local_68;
  span<pstore::sat_entry,__1L> local_60;
  span_iterator<pstore::gsl::span<pstore::sat_entry,__1L>,_false> local_50;
  span<pstore::sat_entry,__1L> sp;
  
  local_78 = &this->regions_;
  local_80 = this;
  local_70 = new_size;
  while( true ) {
    psVar1 = (this->regions_).
             super__Vector_base<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if ((this->regions_).
        super__Vector_base<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>
        ._M_impl.super__Vector_impl_data._M_start == psVar1) {
      _Var3._M_head_impl =
           (this->sat_)._M_t.
           super___uniq_ptr_impl<std::array<pstore::sat_entry,_65536UL>,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
           .super__Head_base<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_false>._M_head_impl;
      lVar5 = 0;
      goto LAB_001132dd;
    }
    peVar2 = psVar1[-1].super___shared_ptr<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    uVar6 = peVar2->offset_;
    if (((uVar6 & 0x3fffff) != 0) || (uVar4 = peVar2->size_, (uVar4 & 0x3fffff) != 0)) break;
    if (uVar6 < new_size) {
      _Var3._M_head_impl =
           (this->sat_)._M_t.
           super___uniq_ptr_impl<std::array<pstore::sat_entry,_65536UL>,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
           .super__Head_base<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_false>._M_head_impl;
      uVar4 = uVar4 + uVar6 >> 0x11;
      for (lVar5 = (long)(0x200000 - uVar4) >> 7; 0 < lVar5; lVar5 = lVar5 + -1) {
        if (*(long *)((long)(_Var3._M_head_impl)->_M_elems + uVar4 + 0x10) != 0 ||
            *(long *)((long)(_Var3._M_head_impl)->_M_elems + uVar4) != 0) goto LAB_001132c1;
        if (*(long *)((long)(_Var3._M_head_impl)->_M_elems + uVar4 + 0x30) != 0 ||
            *(long *)((long)(_Var3._M_head_impl)->_M_elems + uVar4 + 0x20) != 0) {
          uVar4 = uVar4 + 0x20;
          goto LAB_001132c1;
        }
        if (*(long *)((long)(_Var3._M_head_impl)->_M_elems + uVar4 + 0x50) != 0 ||
            *(long *)((long)(_Var3._M_head_impl)->_M_elems + uVar4 + 0x40) != 0) {
          uVar4 = uVar4 + 0x40;
          goto LAB_001132c1;
        }
        if (*(long *)((long)(_Var3._M_head_impl)->_M_elems + uVar4 + 0x70) != 0 ||
            *(long *)((long)(_Var3._M_head_impl)->_M_elems + uVar4 + 0x60) != 0) {
          uVar4 = uVar4 + 0x60;
          goto LAB_001132c1;
        }
        uVar4 = uVar4 + 0x80;
      }
      lVar5 = (long)(0x200000 - uVar4) >> 5;
      if (lVar5 == 1) {
LAB_001132a4:
        if (*(long *)((long)(_Var3._M_head_impl)->_M_elems + uVar4 + 0x10) == 0 &&
            *(long *)((long)(_Var3._M_head_impl)->_M_elems + uVar4) == 0) goto LAB_001132cd;
      }
      else if (lVar5 == 2) {
LAB_00113295:
        if (*(long *)((long)(_Var3._M_head_impl)->_M_elems + uVar4 + 0x10) == 0 &&
            *(long *)((long)(_Var3._M_head_impl)->_M_elems + uVar4) == 0) {
          uVar4 = uVar4 + 0x20;
          goto LAB_001132a4;
        }
      }
      else {
        if (lVar5 != 3) goto LAB_001132cd;
        if (*(long *)((long)(_Var3._M_head_impl)->_M_elems + uVar4 + 0x10) == 0 &&
            *(long *)((long)(_Var3._M_head_impl)->_M_elems + uVar4) == 0) {
          uVar4 = uVar4 + 0x20;
          goto LAB_00113295;
        }
      }
LAB_001132c1:
      if (uVar4 != 0x200000) {
        str = 
        "std::all_of (std::begin (*sat_) + region->end () / address::segment_size, std::end (*sat_), [] (sat_entry const & s) { return s.value == nullptr && s.region == nullptr; })"
        ;
        line = 0x5f;
        goto LAB_00113353;
      }
    }
    else {
      local_98._M_ptr =
           (element_type *)
           (this->sat_)._M_t.
           super___uniq_ptr_impl<std::array<pstore::sat_entry,_65536UL>,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
           .super__Head_base<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_false>._M_head_impl;
      peVar2 = psVar1[-1].super___shared_ptr<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      local_68 = uVar6;
      sp = gsl::span<pstore::sat_entry,_65536L>::subspan
                     ((span<pstore::sat_entry,_65536L> *)&local_98,peVar2->offset_ >> 0x16,
                      peVar2->size_ >> 0x16);
      gsl::span<pstore::sat_entry,_-1L>::begin((span<pstore::sat_entry,__1L> *)&local_50);
      gsl::span<pstore::sat_entry,_-1L>::end(&local_60);
      while ((local_50.span_ !=
              (span<pstore::sat_entry,__1L> *)local_60.storage_.super_extent_type<_1L>.size_ ||
             ((pointer)local_50.index_ != local_60.storage_.data_))) {
        this_00 = gsl::details::span_iterator<pstore::gsl::span<pstore::sat_entry,_-1L>,_false>::
                  operator*(&local_50);
        if ((this_00->region).
            super___shared_ptr<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            psVar1[-1].super___shared_ptr<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr) {
          str = "segment.region == region";
          line = 0x67;
          goto LAB_00113353;
        }
        local_98._M_ptr = (element_type *)0x0;
        local_98._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        std::__shared_ptr<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2>::operator=
                  (&(this_00->region).
                    super___shared_ptr<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2>,
                   &local_98);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_98._M_refcount);
        local_98._M_ptr = (element_type *)0x0;
        local_98._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        std::__shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_ptr<void,_(__gnu_cxx::_Lock_policy)2> *)this_00,
                   (__shared_ptr<void,_(__gnu_cxx::_Lock_policy)2> *)&local_98);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_98._M_refcount);
        gsl::details::span_iterator<pstore::gsl::span<pstore::sat_entry,_-1L>,_false>::operator++
                  (&local_50);
      }
      _Var3._M_head_impl =
           (local_80->sat_)._M_t.
           super___uniq_ptr_impl<std::array<pstore::sat_entry,_65536UL>,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
           .super__Head_base<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_false>._M_head_impl;
      peVar2 = psVar1[-1].super___shared_ptr<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      for (lVar5 = 0; lVar5 != 0x200000; lVar5 = lVar5 + 0x80) {
        if (*(element_type **)((long)(_Var3._M_head_impl)->_M_elems + lVar5 + 0x10) == peVar2) {
          if (lVar5 != 0x200000) {
LAB_00113331:
            str = 
            "std::all_of ( std::begin (*sat_), std::end (*sat_), [&region] (sat_entry const & segment) { return segment.region != region; })"
            ;
            line = 0x6e;
            goto LAB_00113353;
          }
          break;
        }
        if (((*(element_type **)((long)(_Var3._M_head_impl)->_M_elems + lVar5 + 0x30) == peVar2) ||
            (*(element_type **)((long)(_Var3._M_head_impl)->_M_elems + lVar5 + 0x50) == peVar2)) ||
           (*(element_type **)((long)(_Var3._M_head_impl)->_M_elems + lVar5 + 0x70) == peVar2))
        goto LAB_00113331;
      }
      std::
      vector<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>
      ::pop_back(local_78);
      new_size = local_70;
      this = local_80;
      uVar6 = local_68;
    }
LAB_001132cd:
    if (uVar6 < new_size) {
      return;
    }
  }
  str = 
  "region->offset () % address::segment_size == 0 && region->size () % address::segment_size == 0";
  line = 0x58;
LAB_00113353:
  assert_failed(str,
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/core/storage.cpp"
                ,line);
LAB_001132dd:
  if (lVar5 == 0x200000) {
    return;
  }
  if (*(long *)((long)(_Var3._M_head_impl)->_M_elems + lVar5 + 0x10) != 0 ||
      *(long *)((long)(_Var3._M_head_impl)->_M_elems + lVar5) != 0) {
    if (lVar5 == 0x200000) {
      return;
    }
LAB_0011336b:
    str = 
    "std::all_of (std::begin (*sat_), std::end (*sat_), [] (sat_entry const & s) { return s.value == nullptr && s.region == nullptr; })"
    ;
    line = 0x77;
    goto LAB_00113353;
  }
  if (((*(long *)((long)(_Var3._M_head_impl)->_M_elems + lVar5 + 0x30) != 0 ||
        *(long *)((long)(_Var3._M_head_impl)->_M_elems + lVar5 + 0x20) != 0) ||
      (*(long *)((long)(_Var3._M_head_impl)->_M_elems + lVar5 + 0x50) != 0 ||
       *(long *)((long)(_Var3._M_head_impl)->_M_elems + lVar5 + 0x40) != 0)) ||
     (*(long *)((long)(_Var3._M_head_impl)->_M_elems + lVar5 + 0x70) != 0 ||
      *(long *)((long)(_Var3._M_head_impl)->_M_elems + lVar5 + 0x60) != 0)) goto LAB_0011336b;
  lVar5 = lVar5 + 0x80;
  goto LAB_001132dd;
}

Assistant:

void storage::shrink (std::uint64_t const new_size) {
        // We now look backwards through the regions, discarding segments and regions introduced
        // by this transaction
        while (!regions_.empty ()) {
            region::memory_mapper_ptr const & region = regions_.back ();
            PSTORE_ASSERT (region->offset () % address::segment_size == 0 &&
                           region->size () % address::segment_size == 0);
            if (region->offset () < new_size) {
                // Guarantee that segments beyond the mapped memory blocks are null.
                PSTORE_ASSERT (
                    std::all_of (std::begin (*sat_) + region->end () / address::segment_size,
                                 std::end (*sat_), [] (sat_entry const & s) {
                                     return s.value == nullptr && s.region == nullptr;
                                 }));
                return;
            }

            // Remove the entries in the segment address table.
            auto const sp = gsl::make_span (*sat_).subspan (
                region->offset () / address::segment_size, region->size () / address::segment_size);
            std::for_each (std::begin (sp), std::end (sp), [&region] (sat_entry & segment) {
                PSTORE_ASSERT (segment.region == region);
                segment.region = nullptr;
                segment.value = nullptr;
            });
            // Check that we caught every reference to this region.
            PSTORE_ASSERT (std::all_of (
                std::begin (*sat_), std::end (*sat_),
                [&region] (sat_entry const & segment) { return segment.region != region; }));

            // Remove the region itself.
            regions_.pop_back ();
        }

        // There are no mapped memory blocks. The segment address table should be all null.
        PSTORE_ASSERT (std::all_of (std::begin (*sat_), std::end (*sat_), [] (sat_entry const & s) {
            return s.value == nullptr && s.region == nullptr;
        }));
    }